

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_string_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::StringFieldGenerator::GenerateMessageClearingCode
          (StringFieldGenerator *this,Printer *printer)

{
  bool bVar1;
  ulong uVar2;
  undefined1 local_50 [7];
  bool must_be_present;
  Formatter format;
  Printer *printer_local;
  StringFieldGenerator *this_local;
  
  format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)printer;
  Formatter::Formatter((Formatter *)local_50,printer,&(this->super_FieldGenerator).variables_);
  bVar1 = HasHasbit((this->super_FieldGenerator).descriptor_);
  if (((this->inlined_ & 1U) != 0) && (bVar1)) {
    Formatter::operator()<>((Formatter *)local_50,"$DCHK$(!$name$_.IsDefault(nullptr));\n");
  }
  FieldDescriptor::default_value_string_abi_cxx11_((this->super_FieldGenerator).descriptor_);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    Formatter::operator()<>
              ((Formatter *)local_50,
               "$name$_.ClearToDefault($lazy_variable$, GetArenaForAllocation());\n ");
  }
  else if (bVar1) {
    Formatter::operator()<>((Formatter *)local_50,"$name$_.ClearNonDefaultToEmpty();\n");
  }
  else {
    Formatter::operator()<>((Formatter *)local_50,"$name$_.ClearToEmpty();\n");
  }
  Formatter::~Formatter((Formatter *)local_50);
  return;
}

Assistant:

void StringFieldGenerator::GenerateMessageClearingCode(
    io::Printer* printer) const {
  Formatter format(printer, variables_);
  // Two-dimension specialization here: supporting arenas, field presence, or
  // not, and default value is the empty string or not. Complexity here ensures
  // the minimal number of branches / amount of extraneous code at runtime
  // (given that the below methods are inlined one-liners)!

  // If we have a hasbit, then the Clear() method of the protocol buffer
  // will have checked that this field is set.  If so, we can avoid redundant
  // checks against the default variable.
  const bool must_be_present = HasHasbit(descriptor_);

  if (inlined_ && must_be_present) {
    // Calling mutable_$name$() gives us a string reference and sets the has bit
    // for $name$ (in proto2).  We may get here when the string field is inlined
    // but the string's contents have not been changed by the user, so we cannot
    // make an assertion about the contents of the string and could never make
    // an assertion about the string instance.
    //
    // For non-inlined strings, we distinguish from non-default by comparing
    // instances, rather than contents.
    format("$DCHK$(!$name$_.IsDefault(nullptr));\n");
  }

  if (descriptor_->default_value_string().empty()) {
    if (must_be_present) {
      format("$name$_.ClearNonDefaultToEmpty();\n");
    } else {
      format("$name$_.ClearToEmpty();\n");
    }
  } else {
    // Clear to a non-empty default is more involved, as we try to use the
    // Arena if one is present and may need to reallocate the string.
    format(
        "$name$_.ClearToDefault($lazy_variable$, GetArenaForAllocation());\n ");
  }
}